

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O3

void __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::validate_object_name
          (ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
           *this,string_view name)

{
  bool bVar1;
  eval_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  File_Position local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_50._M_str = name._M_str;
  local_50._M_len = name._M_len;
  bVar1 = Name_Validator::valid_object_name<std::basic_string_view<char,std::char_traits<char>>>
                    (&local_50);
  if (bVar1) {
    return;
  }
  this_00 = (eval_error *)__cxa_allocate_exception(0x90);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,local_50._M_str,local_50._M_str + local_50._M_len);
  std::operator+(&local_38,"Invalid Object Name: ",&local_70);
  local_40.line = (this->m_position).line;
  local_40.column = (this->m_position).col;
  exception::eval_error::eval_error
            (this_00,&local_38,&local_40,
             (this->m_filename).
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  __cxa_throw(this_00,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
}

Assistant:

void validate_object_name(std::string_view name) const {
        if (!Name_Validator::valid_object_name(name)) {
          throw exception::eval_error("Invalid Object Name: " + std::string(name), File_Position(m_position.line, m_position.col), *m_filename);
        }
      }